

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

flag float64_le(float64 a,float64 b)

{
  bool bVar1;
  bool bVar2;
  
  if (((~a & 0x7ff0000000000000) != 0 || (a & 0xfffffffffffff) == 0) &&
     ((b & 0xfffffffffffff) == 0 || (~b & 0x7ff0000000000000) != 0)) {
    if ((long)(b ^ a) < 0) {
      bVar2 = (long)a < 0;
      bVar1 = ((b | a) & 0x7fffffffffffffff) == 0;
    }
    else {
      bVar2 = a == b;
      bVar1 = (long)a < 0 != a < b;
    }
    return bVar1 | bVar2;
  }
  float_exception_flags = float_exception_flags | 1;
  return '\0';
}

Assistant:

flag float64_le( float64 a, float64 b )
{
	flag aSign, bSign;

	if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
			|| ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
		) {
		float_raise( float_flag_invalid );
		return 0;
	}
	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign != bSign ) return aSign || ( (bits64) ( ( a | b )<<1 ) == 0 );
	return ( a == b ) || ( aSign ^ ( a < b ) );

}